

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O0

bool __thiscall dap::json::JsonCppSerializer::serialize(JsonCppSerializer *this,object *v)

{
  object *this_00;
  bool bVar1;
  Value *json;
  undefined1 local_80 [8];
  JsonCppSerializer s;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  object *__range2;
  object *local_20;
  object *v_local;
  JsonCppSerializer *this_local;
  
  local_20 = v;
  v_local = (object *)this;
  bVar1 = Json::Value::isObject(this->json);
  if (!bVar1) {
    Json::Value::Value((Value *)&__range2,objectValue);
    Json::Value::operator=(this->json,(Value *)&__range2);
    Json::Value::~Value((Value *)&__range2);
  }
  this_00 = local_20;
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
           ::begin(local_20);
  it = (value_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
       ::end(this_00);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_true>
                              *)&it), bVar1) {
    s._16_8_ = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_false,_true>
               ::operator*(&__end2);
    json = Json::Value::operator[](this->json,(String *)s._16_8_);
    JsonCppSerializer((JsonCppSerializer *)local_80,json);
    bVar1 = serialize((JsonCppSerializer *)local_80,(any *)(s._16_8_ + 0x20));
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    ~JsonCppSerializer((JsonCppSerializer *)local_80);
    if (!bVar1) goto LAB_00f6879c;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_false,_true>
    ::operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_00f6879c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool JsonCppSerializer::serialize(const dap::object& v) {
  if (!json->isObject()) {
    *json = Json::Value(Json::objectValue);
  }
  for (auto& it : v) {
    JsonCppSerializer s(&(*json)[it.first]);
    if (!s.serialize(it.second)) {
      return false;
    }
  }
  return true;
}